

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall CProficiencies::CheckImprove(CProficiencies *this,int pindex,int chance)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  int iVar4;
  int in_EDX;
  int in_ESI;
  CHAR_DATA *in_RDI;
  char **in_R9;
  string buffer;
  undefined1 in_stack_000000d0 [16];
  undefined1 in_stack_000000e0 [16];
  int in_stack_0000109c;
  CHAR_DATA *in_stack_000010a0;
  CHAR_DATA *in_stack_fffffffffffffe78;
  CHAR_DATA *ch;
  char *in_stack_fffffffffffffe80;
  string *txt;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  string local_138 [32];
  int local_118;
  int local_114;
  undefined1 local_108 [232];
  undefined8 local_20;
  undefined1 *local_18;
  CHAR_DATA *local_10;
  char *local_8;
  
  if (((((*(int *)((long)&in_RDI->master + (long)in_ESI * 4 + 4) < 10) &&
        (0 < *(int *)((long)&in_RDI->master + (long)in_ESI * 4 + 4))) &&
       (local_118 = in_EDX, local_114 = in_ESI, iVar1 = number_percent(), iVar1 < 0xb)) &&
      ((iVar1 = number_percent(), iVar1 < 0xb &&
       ((*(int *)((long)&in_RDI->master + (long)local_114 * 4 + 4) < 5 ||
        (iVar2 = number_percent(), iVar1 = *(int *)((long)&in_RDI->master + (long)local_114 * 4 + 4)
        , iVar4 = iVar1 * 6, iVar2 == iVar4 || SBORROW4(iVar2,iVar4) != iVar2 + iVar1 * -6 < 0))))))
     && (iVar1 = number_percent(), iVar1 <= local_118)) {
    *(int *)((long)&in_RDI->master + (long)local_114 * 4 + 4) =
         *(int *)((long)&in_RDI->master + (long)local_114 * 4 + 4) + 1;
    local_108._160_8_ = &local_148;
    local_108._152_8_ = "{}You have {} {}.{}\n\r";
    local_108._168_8_ = "{}You have {} {}.{}\n\r";
    local_148 = "{}You have {} {}.{}\n\r";
    local_108._176_8_ = local_108._160_8_;
    local_140 = std::char_traits<char>::length((char_type *)0x7ac460);
    local_8 = (char *)local_108._152_8_;
    local_150 = get_char_color(in_RDI,in_stack_fffffffffffffe80);
    local_158 = "improved at";
    if (*(int *)((long)&in_RDI->master + (long)local_114 * 4 + 4) == 10) {
      local_158 = "mastered";
    }
    pvVar3 = std::vector<proficiency_type,_std::allocator<proficiency_type>_>::operator[]
                       (&prof_table,(long)local_114);
    local_160 = END_COLOR(in_stack_fffffffffffffe78);
    txt = local_138;
    local_108._128_8_ = local_148;
    local_108._136_8_ = local_140;
    local_108._120_8_ = &local_150;
    local_108._112_8_ = &local_158;
    local_108._96_8_ = &local_160;
    local_108._184_8_ = local_108 + 0x80;
    local_108._80_8_ = local_148;
    local_108._88_8_ = local_140;
    ch = (CHAR_DATA *)(local_138 + 0x30);
    local_108._104_8_ = &pvVar3->name;
    local_108._144_8_ = txt;
    local_108._192_8_ = local_108._80_8_;
    local_108._200_8_ = local_108._88_8_;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char_const*&,char*const&,char*&>
              ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_const_char_*,_char_*,_char_*>
                *)ch,(v9 *)local_108._120_8_,(char **)local_108._112_8_,&pvVar3->name,
               (char **)local_108._96_8_,in_R9);
    local_108._216_8_ = local_108 + 0x40;
    local_20 = 0xcccc;
    local_108._64_8_ = 0xcccc;
    local_108._208_8_ = ch;
    local_108._224_8_ = ch;
    local_18 = (undefined1 *)local_108._216_8_;
    local_10 = ch;
    local_108._72_8_ = ch;
    ::fmt::v9::vformat_abi_cxx11_((string_view)in_stack_000000e0,(format_args)in_stack_000000d0);
    std::__cxx11::string::c_str();
    send_to_char((char *)txt,ch);
    gain_exp(in_stack_000010a0,in_stack_0000109c);
    std::__cxx11::string::~string(local_138);
  }
  return;
}

Assistant:

void CProficiencies::CheckImprove(int pindex, int chance) //chance is out of 10000
{
	if (profs[pindex] >= 10 || profs[pindex] < 1)
		return;

	if (number_percent() > 10)
		return;

	if (number_percent() > 10)
		return;

	if (profs[pindex] > 4)
	{
		if(number_percent() > (6 * profs[pindex]))
			return;
	}

	if (number_percent() > chance)
		return;

	profs[pindex]++;

	auto buffer = fmt::format("{}You have {} {}.{}\n\r", 
		get_char_color(ch, "green"), 
		profs[pindex] == 10 ? "mastered" : "improved at",
		prof_table[pindex].name, 
		END_COLOR(ch));
	send_to_char(buffer.c_str(), ch);

	gain_exp(ch, 250);
}